

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateShutdownCode
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  Descriptor *pDVar2;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar3;
  long lVar4;
  long lVar5;
  
  io::Printer::Print(printer,"delete $classname$::default_instance_;\n","classname",
                     &this->classname_);
  pDVar2 = this->descriptor_;
  if (*(int *)(*(long *)(*(long *)(pDVar2 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"delete $classname$_reflection_;\n","classname",&this->classname_);
    pDVar2 = this->descriptor_;
  }
  if (0 < *(int *)(pDVar2 + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pFVar1 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar4));
      (*pFVar1->_vptr_FieldGenerator[0xc])(pFVar1,printer);
      lVar5 = lVar5 + 1;
      pDVar2 = this->descriptor_;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(pDVar2 + 0x2c));
  }
  if (0 < *(int *)(pDVar2 + 0x38)) {
    lVar4 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->nested_generators_,lVar4);
      if (psVar3->ptr_ == (MessageGenerator *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cxx::MessageGenerator]"
                     );
      }
      GenerateShutdownCode(psVar3->ptr_,printer);
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)(this->descriptor_ + 0x38));
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateShutdownCode(io::Printer* printer) {
  printer->Print(
    "delete $classname$::default_instance_;\n",
    "classname", classname_);

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "delete $classname$_reflection_;\n",
      "classname", classname_);
  }

  // Handle default instances of fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateShutdownCode(printer);
  }

  // Handle nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateShutdownCode(printer);
  }
}